

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.h
# Opt level: O3

void __thiscall
chrono::fea::ChLoadXYZROTnodeForceAbsolute::ChLoadXYZROTnodeForceAbsolute
          (ChLoadXYZROTnodeForceAbsolute *this,ChLoadXYZROTnodeForceAbsolute *param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  ChObj::ChObj((ChObj *)this,(ChObj *)param_1);
  (this->super_ChLoadXYZROTnode).super_ChLoadCustom.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustom_00b20db0;
  peVar2 = (param_1->super_ChLoadXYZROTnode).super_ChLoadCustom.loadable.
           super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_ChLoadXYZROTnode).super_ChLoadCustom.super_ChLoadBase.jacobians =
       (param_1->super_ChLoadXYZROTnode).super_ChLoadCustom.super_ChLoadBase.jacobians;
  (this->super_ChLoadXYZROTnode).super_ChLoadCustom.loadable.
  super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  p_Var1 = (param_1->super_ChLoadXYZROTnode).super_ChLoadCustom.loadable.
           super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_ChLoadXYZROTnode).super_ChLoadCustom.loadable.
  super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)
             &(this->super_ChLoadXYZROTnode).super_ChLoadCustom.load_Q,
             (DenseStorage<double,__1,__1,_1,_0> *)
             &(param_1->super_ChLoadXYZROTnode).super_ChLoadCustom.load_Q);
  (this->super_ChLoadXYZROTnode).computed_abs_force.m_data[0] =
       (param_1->super_ChLoadXYZROTnode).computed_abs_force.m_data[0];
  (this->super_ChLoadXYZROTnode).computed_abs_force.m_data[1] =
       (param_1->super_ChLoadXYZROTnode).computed_abs_force.m_data[1];
  (this->super_ChLoadXYZROTnode).computed_abs_force.m_data[2] =
       (param_1->super_ChLoadXYZROTnode).computed_abs_force.m_data[2];
  (this->super_ChLoadXYZROTnode).computed_abs_torque.m_data[0] =
       (param_1->super_ChLoadXYZROTnode).computed_abs_torque.m_data[0];
  (this->super_ChLoadXYZROTnode).computed_abs_torque.m_data[1] =
       (param_1->super_ChLoadXYZROTnode).computed_abs_torque.m_data[1];
  (this->super_ChLoadXYZROTnode).computed_abs_torque.m_data[2] =
       (param_1->super_ChLoadXYZROTnode).computed_abs_torque.m_data[2];
  (this->super_ChLoadXYZROTnode).super_ChLoadCustom.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadXYZROTnodeForceAbsolute_00b2af90;
  (this->m_force_base).m_data[0] = (param_1->m_force_base).m_data[0];
  (this->m_force_base).m_data[1] = (param_1->m_force_base).m_data[1];
  (this->m_force_base).m_data[2] = (param_1->m_force_base).m_data[2];
  p_Var3 = (param_1->m_modulation).
           super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var1 = (param_1->m_modulation).
           super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (this->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->m_scale = param_1->m_scale;
  return;
}

Assistant:

class ChApi ChLoadXYZROTnodeForceAbsolute : public ChLoadXYZROTnode {
  public:
    ChLoadXYZROTnodeForceAbsolute(std::shared_ptr<ChNodeFEAxyzrot> node,  ///< node to apply load to
                                  const ChVector<>& force  ///< force to apply, assumed in absolute coordsys,
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLoadXYZROTnodeForceAbsolute* Clone() const override { return new ChLoadXYZROTnodeForceAbsolute(*this); }

    /// Compute the force on the node, in absolute coordsystem,
    /// given absolute position and speed of node passed via node_frame_abs_pos_vel.
    virtual void ComputeForceTorque(const ChFrameMoving<>& node_frame_abs_pos_vel,
                                    ChVector<>& abs_force,
                                    ChVector<>& abs_torque) override;

    /// Set the applied force vector: it is assumed constant, unless a
    /// non-constant scaling time function is provided.
    /// It is expressed in absolute coordinates.
    void SetForceBase(const ChVector<>& force);

    /// Return the current force vector (scaled by the current modulation value).
    ChVector<> GetForce() const;

    /// Set modulation function.
    /// This is a function of time which (optionally) modulates the specified applied force.
    /// By default the modulation is a constant function, always returning a value of 1.
    void SetModulationFunction(std::shared_ptr<ChFunction> modulation) { m_modulation = modulation; }

  protected:
    ChVector<> m_force_base;  ///< base force value

    std::shared_ptr<ChFunction> m_modulation;  ///< modulation function of time
    double m_scale;                            ///< scaling factor (current modulation value)

    virtual bool IsStiff() override { return false; }

    virtual void Update(double time) override;
}